

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

bool __thiscall
JsUtil::ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>::
Any<Js::RecyclableObjectWalker::GetChildrenCount()::__0>
          (ReadOnlyList<Js::DebuggerPropertyDisplayInfo*,Memory::ArenaAllocator,DefaultComparer>
           *this,anon_class_8_1_66460f8e function)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *(uint *)(this + 0x10);
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while (**(int **)(*(long *)(this + 8) + uVar4 * 8) != *function.propertyId);
  return (long)uVar4 < (long)(int)uVar1;
}

Assistant:

bool Any(TConditionalFunction function)
        {
            for (int i = 0; i < count; ++i)
            {
                if (function(this->buffer[i]))
                {
                    return true;
                }
            }

            return false;
        }